

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.h
# Opt level: O2

void __thiscall
ExpressionTranslateContext::~ExpressionTranslateContext(ExpressionTranslateContext *this)

{
  SmallArray<unsigned_int,_32U>::~SmallArray(&this->loopContinueIdStack);
  SmallArray<unsigned_int,_32U>::~SmallArray(&this->loopBreakIdStack);
  return;
}

Assistant:

ExpressionTranslateContext(ExpressionContext &ctx, OutputContext &output, Allocator *allocator): ctx(ctx), output(output), loopBreakIdStack(allocator), loopContinueIdStack(allocator), allocator(allocator)
	{
		mainName = "main";

		indent = "\t";

		errorPos = 0;
		errorBuf = 0;
		errorBufSize = 0;

		depth = 0;

		nextLoopBreakId = 1;
		nextLoopContinueId = 1;
		nextReturnValueId = 1;

		skipFunctionDefinitions = false;

		currentFunction = 0;
	}